

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-dcm-bias-estimation.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  void *pvVar2;
  int local_c;
  int exitCode;
  
  local_c = testUnidimDcmBiasEstimator(2);
  if (local_c == 0) {
    local_c = testDcmBiasEstimator(3);
    if (local_c == 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,"Succeeded");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar1 = std::operator<<((ostream *)&std::cout,"Failed, testDcmBiasEstimator error code: ");
      pvVar2 = (void *)std::ostream::operator<<(poVar1,local_c);
      std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"Failed, testUnidimDcmBiasEstimator error code: "
                            );
    pvVar2 = (void *)std::ostream::operator<<(poVar1,local_c);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  }
  return local_c;
}

Assistant:

int main()
{
  int exitCode;

  exitCode = testUnidimDcmBiasEstimator(2);

  if(exitCode != 0)
  {
    std::cout << "Failed, testUnidimDcmBiasEstimator error code: " << exitCode << std::endl;
    return exitCode;
  }

  exitCode = testDcmBiasEstimator(3);
  if(exitCode != 0)
  {
    std::cout << "Failed, testDcmBiasEstimator error code: " << exitCode << std::endl;
    return exitCode;
  }

  std::cout << "Succeeded" << std::endl;
  return exitCode;
}